

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  uint *puVar1;
  uchar uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  
  if (num_bits != 0) {
    iVar5 = this->m_bit_count - num_bits;
    this->m_bit_count = iVar5;
    this->m_bit_buf = this->m_bit_buf | (ulong)bits << ((byte)iVar5 & 0x3f);
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    if (iVar5 < 0x39) {
      do {
        uVar2 = *(uchar *)((long)&this->m_bit_buf + 7);
        uVar3 = (this->m_output_buf).m_size;
        if (((this->m_output_buf).m_capacity <= uVar3) &&
           (bVar4 = elemental_vector::increase_capacity
                              ((elemental_vector *)&this->m_output_buf,uVar3 + 1,true,1,
                               (object_mover)0x0,true), !bVar4)) {
          return false;
        }
        (this->m_output_buf).m_p[(this->m_output_buf).m_size] = uVar2;
        puVar1 = &(this->m_output_buf).m_size;
        *puVar1 = *puVar1 + 1;
        this->m_bit_buf = this->m_bit_buf << 8;
        iVar5 = this->m_bit_count;
        this->m_bit_count = iVar5 + 8;
      } while (iVar5 < 0x31);
    }
  }
  return true;
}

Assistant:

bool symbol_codec::put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_bit_count -= num_bits;
      m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

      m_total_bits_written += num_bits;

      while (m_bit_count <= (cBitBufSize - 8))
      {
         if (!m_output_buf.try_push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8))))
            return false;

         m_bit_buf <<= 8;
         m_bit_count += 8;
      }

      return true;
   }